

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_ReleaseOneofMessageTest_Test::
TestBody(GeneratedMessageReflectionTest_ReleaseOneofMessageTest_Test *this)

{
  Message *pMVar1;
  Reflection *pRVar2;
  bool bVar3;
  Reflection *this_00;
  FieldDescriptor *pFVar4;
  char *pcVar5;
  char *in_R9;
  string local_168;
  AssertHelper local_148;
  Message local_140;
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_110;
  Message local_108;
  Message *local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_c8;
  Message local_c0;
  bool local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_;
  Message *local_90;
  Message *released;
  Message *local_78;
  Message *sub_message;
  Reflection *reflection;
  Descriptor *descriptor;
  undefined1 local_50 [8];
  TestOneof2 message;
  GeneratedMessageReflectionTest_ReleaseOneofMessageTest_Test *this_local;
  
  message.field_0._impl_._oneof_case_ = (uint32_t  [2])this;
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)local_50);
  TestUtil::ReflectionTester::SetOneofViaReflection((Message *)local_50);
  reflection = (Reflection *)proto2_unittest::TestOneof2::descriptor();
  this_00 = proto2_unittest::TestOneof2::GetReflection();
  pRVar2 = reflection;
  sub_message = (Message *)this_00;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&released,"foo_lazy_message");
  pFVar4 = Descriptor::FindFieldByName((Descriptor *)pRVar2,_released);
  local_78 = Reflection::GetMessage(this_00,(Message *)local_50,pFVar4,(MessageFactory *)0x0);
  pRVar2 = reflection;
  pMVar1 = sub_message;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_.message_,
             "foo_lazy_message");
  pFVar4 = Descriptor::FindFieldByName((Descriptor *)pRVar2,stack0xffffffffffffff60);
  local_90 = Reflection::ReleaseMessage
                       ((Reflection *)pMVar1,(Message *)local_50,pFVar4,(MessageFactory *)0x0);
  local_b1 = local_90 != (Message *)0x0;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b0,&local_b1,(type *)0x0)
  ;
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar3) {
    testing::Message::Message(&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_b0,
               (AssertionResult *)"released != nullptr","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x541,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_100 = local_78;
  testing::internal::EqHelper::
  Compare<const_google::protobuf::Message_*,_google::protobuf::Message_*,_nullptr>
            ((EqHelper *)local_f8,"&sub_message","released",&local_100,&local_90);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar3) {
    testing::Message::Message(&local_108);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x543,pcVar5);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  if (local_90 != (Message *)0x0) {
    (*(local_90->super_MessageLite)._vptr_MessageLite[1])();
  }
  pRVar2 = reflection;
  pMVar1 = sub_message;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__1.message_,
             "foo_lazy_message");
  pFVar4 = Descriptor::FindFieldByName((Descriptor *)pRVar2,stack0xfffffffffffffee0);
  local_90 = Reflection::ReleaseMessage
                       ((Reflection *)pMVar1,(Message *)local_50,pFVar4,(MessageFactory *)0x0);
  local_131 = local_90 == (Message *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_130,&local_131,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar3) {
    testing::Message::Message(&local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_168,(internal *)local_130,(AssertionResult *)"released == nullptr","false",
               "true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x549,pcVar5);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)local_50);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, ReleaseOneofMessageTest) {
  unittest::TestOneof2 message;
  TestUtil::ReflectionTester::SetOneofViaReflection(&message);

  const Descriptor* descriptor = unittest::TestOneof2::descriptor();
  const Reflection* reflection = message.GetReflection();
  const Message& sub_message = reflection->GetMessage(
      message, descriptor->FindFieldByName("foo_lazy_message"));
  (void)sub_message;  // unused in somce configurations
  Message* released = reflection->ReleaseMessage(
      &message, descriptor->FindFieldByName("foo_lazy_message"));

  EXPECT_TRUE(released != nullptr);
  if (!internal::DebugHardenForceCopyInRelease()) {
    EXPECT_EQ(&sub_message, released);
  }
  delete released;

  released = reflection->ReleaseMessage(
      &message, descriptor->FindFieldByName("foo_lazy_message"));
  EXPECT_TRUE(released == nullptr);
}